

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void signal_handler(int signo)

{
  mapped_type *this;
  key_type local_4;
  
  this = std::__detail::
         _Map_base<int,_std::pair<const_int,_std::function<void_()>_>,_std::allocator<std::pair<const_int,_std::function<void_()>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[]((_Map_base<int,_std::pair<const_int,_std::function<void_()>_>,_std::allocator<std::pair<const_int,_std::function<void_()>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&functors,&local_4);
  std::function<void_()>::operator()(this);
  return;
}

Assistant:

static void signal_handler(int signo) { functors[signo](); }